

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_loader.cpp
# Opt level: O2

uint32_t __thiscall
embree::OBJLoader::getVertex
          (OBJLoader *this,
          map<embree::Vertex,_unsigned_int,_std::less<embree::Vertex>,_std::allocator<std::pair<const_embree::Vertex,_unsigned_int>_>_>
          *vertexMap,Ref<embree::SceneGraph::TriangleMeshNode> *mesh,Vertex *i)

{
  ulong uVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  pointer pvVar4;
  size_t sVar5;
  Vec3fa *pVVar6;
  TriangleMeshNode *pTVar7;
  pointer pVVar8;
  pointer pVVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  undefined8 uVar14;
  iterator iVar15;
  Vec3fa *pVVar16;
  long lVar17;
  ostream *poVar18;
  mapped_type *pmVar19;
  ulong uVar20;
  uint32_t uVar21;
  ulong uVar22;
  ulong uVar23;
  anon_union_8_2_4062524c_for_Vec2<float>_1 local_38;
  
  iVar15 = std::
           _Rb_tree<embree::Vertex,_std::pair<const_embree::Vertex,_unsigned_int>,_std::_Select1st<std::pair<const_embree::Vertex,_unsigned_int>_>,_std::less<embree::Vertex>,_std::allocator<std::pair<const_embree::Vertex,_unsigned_int>_>_>
           ::find(&vertexMap->_M_t,i);
  if ((_Rb_tree_header *)iVar15._M_node == &(vertexMap->_M_t)._M_impl.super__Rb_tree_header) {
    if ((ulong)i->v < (this->v).size_active) {
      pvVar4 = (mesh->ptr->positions).
               super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pVVar6 = (this->v).items + i->v;
      fVar10 = (pVVar6->field_0).m128[0];
      fVar11 = (pVVar6->field_0).m128[1];
      fVar12 = (pVVar6->field_0).m128[2];
      fVar13 = (pVVar6->field_0).m128[3];
      sVar5 = pvVar4->size_active;
      uVar20 = pvVar4->size_alloced;
      uVar1 = sVar5 + 1;
      if (uVar20 < uVar1) {
        uVar22 = uVar20;
        uVar23 = uVar1;
        if (uVar20 != 0) {
          for (; uVar23 = uVar22, uVar22 < uVar1; uVar22 = uVar22 * 2 + (ulong)(uVar22 * 2 == 0)) {
          }
        }
        if (uVar20 != uVar23) {
          pVVar6 = pvVar4->items;
          pVVar16 = (Vec3fa *)alignedMalloc(uVar23 << 4,0x10);
          pvVar4->items = pVVar16;
          lVar17 = 0;
          for (uVar20 = 0; uVar20 < pvVar4->size_active; uVar20 = uVar20 + 1) {
            puVar3 = (undefined8 *)((long)&pVVar6->field_0 + lVar17);
            uVar14 = puVar3[1];
            puVar2 = (undefined8 *)((long)&pvVar4->items->field_0 + lVar17);
            *puVar2 = *puVar3;
            puVar2[1] = uVar14;
            lVar17 = lVar17 + 0x10;
          }
          alignedFree(pVVar6);
          pvVar4->size_alloced = uVar23;
        }
      }
      pvVar4->size_active = uVar1;
      pVVar6 = pvVar4->items + sVar5;
      (pVVar6->field_0).m128[0] = fVar10;
      (pVVar6->field_0).m128[1] = fVar11;
      (pVVar6->field_0).m128[2] = fVar12;
      (pVVar6->field_0).m128[3] = fVar13;
    }
    else {
      poVar18 = std::operator<<((ostream *)&std::cout,"WARNING: corrupted OBJ file");
      std::endl<char,std::char_traits<char>>(poVar18);
    }
    if (i->vn != 0xffffffff) {
      while( true ) {
        pvVar4 = (mesh->ptr->normals).
                 super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar1 = pvVar4->size_active;
        uVar20 = ((mesh->ptr->positions).
                  super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->size_active;
        if (uVar20 <= uVar1) break;
        uVar20 = pvVar4->size_alloced;
        if (uVar20 <= uVar1) {
          uVar22 = uVar20;
          uVar23 = uVar1 + 1;
          if (uVar20 != 0) {
            for (; uVar23 = uVar22, uVar22 <= uVar1; uVar22 = uVar22 * 2 + (ulong)(uVar22 * 2 == 0))
            {
            }
          }
          if (uVar20 != uVar23) {
            pVVar6 = pvVar4->items;
            pVVar16 = (Vec3fa *)alignedMalloc(uVar23 << 4,0x10);
            pvVar4->items = pVVar16;
            lVar17 = 0;
            for (uVar20 = 0; uVar20 < pvVar4->size_active; uVar20 = uVar20 + 1) {
              puVar3 = (undefined8 *)((long)&pVVar6->field_0 + lVar17);
              uVar14 = puVar3[1];
              puVar2 = (undefined8 *)((long)&pvVar4->items->field_0 + lVar17);
              *puVar2 = *puVar3;
              puVar2[1] = uVar14;
              lVar17 = lVar17 + 0x10;
            }
            alignedFree(pVVar6);
            pvVar4->size_alloced = uVar23;
          }
        }
        pVVar6 = pvVar4->items;
        pvVar4->size_active = uVar1 + 1;
        *(undefined8 *)&pVVar6[uVar1].field_0 = 0;
        *(undefined8 *)((long)&pVVar6[uVar1].field_0 + 8) = 0;
      }
      if ((ulong)i->vn < (this->vn).size_active) {
        pVVar16 = pvVar4->items;
        pVVar6 = (this->vn).items + i->vn;
        uVar14 = *(undefined8 *)((long)&pVVar6->field_0 + 8);
        *(undefined8 *)&pVVar16[uVar20 - 1].field_0 = *(undefined8 *)&pVVar6->field_0;
        *(undefined8 *)((long)&pVVar16[uVar20 - 1].field_0 + 8) = uVar14;
      }
      else {
        poVar18 = std::operator<<((ostream *)&std::cout,"WARNING: corrupted OBJ file");
        std::endl<char,std::char_traits<char>>(poVar18);
      }
    }
    if (i->vt != 0xffffffff) {
      while( true ) {
        pTVar7 = mesh->ptr;
        pVVar8 = (pTVar7->texcoords).
                 super__Vector_base<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar1 = ((pTVar7->positions).
                 super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->size_active;
        if (uVar1 <= (ulong)((long)(pTVar7->texcoords).
                                   super__Vector_base<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar8 >> 3))
        break;
        local_38 = (anon_union_8_2_4062524c_for_Vec2<float>_1)0x0;
        std::vector<embree::Vec2<float>,std::allocator<embree::Vec2<float>>>::
        emplace_back<embree::Vec2<float>>
                  ((vector<embree::Vec2<float>,std::allocator<embree::Vec2<float>>> *)
                   &pTVar7->texcoords,(Vec2<float> *)&local_38.field_0);
      }
      uVar20 = (ulong)i->vt;
      pVVar9 = (this->vt).
               super__Vector_base<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (uVar20 < (ulong)((long)(this->vt).
                                 super__Vector_base<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar9 >> 3)) {
        pVVar8[uVar1 - 1].field_0.field_0.x = pVVar9[uVar20].field_0.field_0.x;
        pVVar8[uVar1 - 1].field_0.field_0.y = pVVar9[uVar20].field_0.field_0.y;
      }
      else {
        poVar18 = std::operator<<((ostream *)&std::cout,"WARNING: corrupted OBJ file");
        std::endl<char,std::char_traits<char>>(poVar18);
      }
    }
    uVar21 = (int)((mesh->ptr->positions).
                   super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->size_active - 1;
    pmVar19 = std::
              map<embree::Vertex,_unsigned_int,_std::less<embree::Vertex>,_std::allocator<std::pair<const_embree::Vertex,_unsigned_int>_>_>
              ::operator[](vertexMap,i);
    *pmVar19 = uVar21;
  }
  else {
    uVar21 = *(uint32_t *)((long)&iVar15._M_node[1]._M_parent + 4);
  }
  return uVar21;
}

Assistant:

uint32_t OBJLoader::getVertex(std::map<Vertex,uint32_t>& vertexMap, Ref<SceneGraph::TriangleMeshNode> mesh, const Vertex& i)
  {
    const std::map<Vertex, uint32_t>::iterator& entry = vertexMap.find(i);
    if (entry != vertexMap.end()) return(entry->second);
    
    if (i.v >= v.size()) std::cout << "WARNING: corrupted OBJ file" << std::endl;
    else mesh->positions[0].push_back(v[i.v]);
      
    if (i.vn != -1) {
      while (mesh->normals[0].size() < mesh->positions[0].size()) mesh->normals[0].push_back(zero); // some vertices might not had a normal

      if (i.vn >= vn.size()) std::cout << "WARNING: corrupted OBJ file" << std::endl;
      else mesh->normals[0][mesh->positions[0].size()-1] = vn[i.vn];
    }
    if (i.vt != -1) {
      while (mesh->texcoords.size() < mesh->positions[0].size()) mesh->texcoords.push_back(zero); // some vertices might not had a texture coordinate

      if (i.vt >= vt.size()) std::cout << "WARNING: corrupted OBJ file" << std::endl;
      else mesh->texcoords[mesh->positions[0].size()-1] = vt[i.vt];
    }
    return (vertexMap[i] = (unsigned int)(mesh->positions[0].size()) - 1);
  }